

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O0

int nsync_mu_semaphore_p_with_deadline(nsync_semaphore *s,nsync_time abs_deadline)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  nsync_time nVar5;
  timespec *local_50;
  timespec *ts;
  timespec ts_buf;
  int local_30;
  int futex_result;
  int result;
  int i;
  futex *f;
  nsync_semaphore *s_local;
  nsync_time abs_deadline_local;
  
  local_30 = 0;
  do {
    iVar1 = *(int *)s->sem_space;
    if (iVar1 == 0) {
      local_50 = (timespec *)0x0;
      nVar5.tv_nsec = 999999999;
      nVar5.tv_sec = 0x7fffffffffffffff;
      iVar2 = nsync_time_cmp(abs_deadline,nVar5);
      if (iVar2 != 0) {
        memset(&ts,0,0x10);
        local_50 = (timespec *)&ts;
        ts = (timespec *)abs_deadline.tv_sec;
        ts_buf.tv_sec = abs_deadline.tv_nsec;
      }
      ts_buf.tv_nsec._4_4_ = futex((int *)s,0x189,0,local_50,(int *)0x0,-1);
      if ((((ts_buf.tv_nsec._4_4_ != 0) && (piVar3 = __errno_location(), *piVar3 != 4)) &&
          (piVar3 = __errno_location(), *piVar3 != 0xb)) &&
         (piVar3 = __errno_location(), *piVar3 != 0x6e)) {
        uRam0000000000000000 = 0;
      }
      if ((ts_buf.tv_nsec._4_4_ == -1) && (piVar3 = __errno_location(), *piVar3 == 0x6e)) {
        nVar5 = nsync_time_now();
        iVar2 = nsync_time_cmp(abs_deadline,nVar5);
        if (iVar2 < 1) {
          local_30 = 0x6e;
        }
      }
    }
    bVar4 = false;
    if ((local_30 == 0) && (bVar4 = true, iVar1 != 0)) {
      LOCK();
      bVar4 = iVar1 == *(int *)s->sem_space;
      if (bVar4) {
        *(int *)s->sem_space = iVar1 + -1;
      }
      UNLOCK();
      bVar4 = !bVar4;
    }
  } while (bVar4);
  return local_30;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}